

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.cpp
# Opt level: O1

MPP_RET rc_brief_get_all(RcApiQueryAll *query)

{
  uint max_count;
  RcApiBrief *brief;
  MPP_RET MVar1;
  RcImplApiService *this;
  
  if (query == (RcApiQueryAll *)0x0) {
    _mpp_log_l(2,"rc_impl","invalide NULL query input\n","rc_brief_get_all");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    brief = query->brief;
    max_count = query->max_count;
    if ((int)max_count < 1 || brief == (RcApiBrief *)0x0) {
      _mpp_log_l(2,"rc_impl","invalide brief buffer %p max count %d\n","rc_brief_get_all",brief,
                 (ulong)max_count);
      MVar1 = MPP_NOK;
    }
    else {
      this = RcImplApiService::get_instance();
      RcImplApiService::api_get_all(this,brief,&query->count,max_count);
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET rc_brief_get_all(RcApiQueryAll *query)
{
    if (NULL == query) {
        mpp_err_f("invalide NULL query input\n");
        return MPP_ERR_NULL_PTR;
    }

    RcApiBrief *brief = query->brief;
    RK_S32 *count = &query->count;
    RK_S32 max_count = query->max_count;

    if (NULL == brief || max_count <= 0) {
        mpp_err_f("invalide brief buffer %p max count %d\n", brief, max_count);
        return MPP_NOK;
    }

    return RcImplApiService::get_instance()->api_get_all(brief, count, max_count);
}